

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Huffman.cpp
# Opt level: O2

void __thiscall HuffmanEncoder::build(HuffmanEncoder *this,shared_ptr<HuffmanNode> *root)

{
  long lVar1;
  mapped_type *pmVar2;
  __shared_ptr<HuffmanNode,_(__gnu_cxx::_Lock_policy)2> local_48 [2];
  __shared_ptr<HuffmanNode,_(__gnu_cxx::_Lock_policy)2> local_28;
  
  std::__shared_ptr<HuffmanNode,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (local_48,&(((root->super___shared_ptr<HuffmanNode,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)
                       ->left_).super___shared_ptr<HuffmanNode,_(__gnu_cxx::_Lock_policy)2>);
  lVar1 = CONCAT71(local_48[0]._M_ptr._1_7_,(char)local_48[0]._M_ptr);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_48[0]._M_refcount);
  if (lVar1 != 0) {
    std::__cxx11::string::append((char *)&this->temp_code_);
    std::__shared_ptr<HuffmanNode,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (local_48,&(((root->super___shared_ptr<HuffmanNode,_(__gnu_cxx::_Lock_policy)2>).
                          _M_ptr)->left_).
                         super___shared_ptr<HuffmanNode,_(__gnu_cxx::_Lock_policy)2>);
    build(this,(shared_ptr<HuffmanNode> *)local_48);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_48[0]._M_refcount);
  }
  std::__shared_ptr<HuffmanNode,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (local_48,&(((root->super___shared_ptr<HuffmanNode,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)
                       ->right_).super___shared_ptr<HuffmanNode,_(__gnu_cxx::_Lock_policy)2>);
  lVar1 = CONCAT71(local_48[0]._M_ptr._1_7_,(char)local_48[0]._M_ptr);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_48[0]._M_refcount);
  if (lVar1 != 0) {
    std::__cxx11::string::append((char *)&this->temp_code_);
    std::__shared_ptr<HuffmanNode,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (local_48,&(((root->super___shared_ptr<HuffmanNode,_(__gnu_cxx::_Lock_policy)2>).
                          _M_ptr)->right_).
                         super___shared_ptr<HuffmanNode,_(__gnu_cxx::_Lock_policy)2>);
    build(this,(shared_ptr<HuffmanNode> *)local_48);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_48[0]._M_refcount);
  }
  std::__shared_ptr<HuffmanNode,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (local_48,&(((root->super___shared_ptr<HuffmanNode,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)
                       ->right_).super___shared_ptr<HuffmanNode,_(__gnu_cxx::_Lock_policy)2>);
  if (CONCAT71(local_48[0]._M_ptr._1_7_,(char)local_48[0]._M_ptr) == 0) {
    std::__shared_ptr<HuffmanNode,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_28,
               &(((root->super___shared_ptr<HuffmanNode,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->left_
                ).super___shared_ptr<HuffmanNode,_(__gnu_cxx::_Lock_policy)2>);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_28._M_refcount);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_48[0]._M_refcount);
    if (local_28._M_ptr == (element_type *)0x0) {
      local_48[0]._M_ptr._0_1_ =
           ((root->super___shared_ptr<HuffmanNode,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->c_;
      pmVar2 = std::
               map<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<char>,_std::allocator<std::pair<const_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator[](&this->table_,(key_type *)local_48);
      std::__cxx11::string::_M_assign((string *)pmVar2);
    }
  }
  else {
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_48[0]._M_refcount);
  }
  std::__cxx11::string::substr((ulong)local_48,(ulong)&this->temp_code_);
  std::__cxx11::string::operator=((string *)&this->temp_code_,(string *)local_48);
  std::__cxx11::string::~string((string *)local_48);
  return;
}

Assistant:

void HuffmanEncoder::build(const shared_ptr<HuffmanNode>& root) {
  if (root->get_left() != nullptr) {
    temp_code_.append("0");
    build(root->get_left());
  }

  if (root->get_right() != nullptr) {
    temp_code_.append("1");
    build(root->get_right());
  }

  if (root->get_right() == nullptr &&
    root->get_left() == nullptr) {
    table_[root->get_c()] = temp_code_;
  }

  temp_code_ = temp_code_.substr(0, temp_code_.size() - 1);
}